

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void nv2_if(Context *ctx)

{
  int iVar1;
  int iVar2;
  char local_38 [4];
  int label;
  char failbranch [32];
  Context *ctx_local;
  
  if ((ctx->profile_supports_nv4 == 0) && (iVar2 = shader_is_pixel(ctx), iVar2 == 0)) {
    iVar2 = allocate_branch_label(ctx);
    get_ARB1_branch_label_name(ctx,iVar2,local_38,0x20);
    if ((uint)ctx->branch_labels_stack_index < 0x20) {
      iVar1 = ctx->branch_labels_stack_index;
      ctx->branch_labels_stack_index = iVar1 + 1;
      ctx->branch_labels_stack[iVar1] = iVar2;
      output_line(ctx,"BRA %s (EQ.x);",local_38);
      return;
    }
    __assert_fail("((size_t) ctx->branch_labels_stack_index) < STATICARRAYLEN(ctx->branch_labels_stack)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                  ,0x1ea7,"void nv2_if(Context *)");
  }
  output_line(ctx,"IF EQ.x;");
  return;
}

Assistant:

static void nv2_if(Context *ctx)
{
    // The condition code register MUST be set up before this!
    // nv2 fragment programs (and everything nv4) have a real IF.
    if ( (support_nv4(ctx)) || (shader_is_pixel(ctx)) )
        output_line(ctx, "IF EQ.x;");
    else
    {
        // there's no IF construct, but we can use a branch to a label.
        char failbranch[32];
        const int label = allocate_branch_label(ctx);
        get_ARB1_branch_label_name(ctx, label, failbranch, sizeof (failbranch));

        assert(((size_t) ctx->branch_labels_stack_index)
                 < STATICARRAYLEN(ctx->branch_labels_stack));

        ctx->branch_labels_stack[ctx->branch_labels_stack_index++] = label;

        // !!! FIXME: should this be NE? (EQ would jump to the ELSE for the IF condition, right?).
        output_line(ctx, "BRA %s (EQ.x);", failbranch);
    } // else
}